

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.cpp
# Opt level: O0

void __thiscall
Js::TypePath::AddSingletonInstanceFieldAt(TypePath *this,PropertyIndex index,int typePathLength)

{
  RecyclerWeakReference<Js::DynamicObject> *pRVar1;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  BOOLEAN BVar5;
  byte bVar6;
  bool bVar7;
  undefined4 *puVar8;
  Data *pDVar9;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar10;
  RecyclerWeakReference<Js::DynamicObject> *this_00;
  PropertyRecord *this_01;
  char16 *pcVar11;
  DynamicObject *local_48;
  ushort local_1a;
  PropertyIndex i;
  int typePathLength_local;
  PropertyIndex index_local;
  TypePath *this_local;
  
  bVar3 = GetPathLength(this);
  if (bVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypePath.cpp"
                                ,0xbe,"(index < this->GetPathLength())",
                                "index < this->GetPathLength()");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  bVar3 = GetMaxInitializedLength(this);
  if (typePathLength < (int)(uint)bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypePath.cpp"
                                ,0xbf,"(typePathLength >= this->GetMaxInitializedLength())",
                                "typePathLength >= this->GetMaxInitializedLength()");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  bVar3 = GetMaxInitializedLength(this);
  if (index < bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypePath.cpp"
                                ,0xc0,"(index >= this->GetMaxInitializedLength())",
                                "index >= this->GetMaxInitializedLength()");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  pDVar9 = GetData(this);
  BVar5 = BVStatic<128UL>::Test(&pDVar9->fixedFields,(uint)index);
  if (BVar5 == '\0') {
    pDVar9 = GetData(this);
    BVar5 = BVStatic<128UL>::Test(&pDVar9->usedFixedFields,(uint)index);
    if (BVar5 == '\0') goto LAB_014f981f;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar8 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypePath.cpp"
                              ,0xc1,
                              "(!this->GetData()->fixedFields.Test(index) && !this->GetData()->usedFixedFields.Test(index))"
                              ,
                              "!this->GetData()->fixedFields.Test(index) && !this->GetData()->usedFixedFields.Test(index)"
                             );
  if (!bVar4) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar8 = 0;
LAB_014f981f:
  SetMaxInitializedLength(this,index + 1);
  bVar4 = Phases::IsEnabled((Phases *)&DAT_01ec1678,FixMethodPropsPhase);
  if ((bVar4) && ((DAT_01ec73ca & 1) != 0)) {
    ppRVar10 = Memory::PointerValue<Memory::RecyclerWeakReference<Js::DynamicObject>>
                         (&this->singletonInstance);
    pRVar1 = *ppRVar10;
    ppRVar10 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                         ((WriteBarrierPtr *)&this->singletonInstance);
    if (*ppRVar10 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      local_48 = (DynamicObject *)0x0;
    }
    else {
      this_00 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::
                operator->(&this->singletonInstance);
      local_48 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this_00);
    }
    Output::Print(L"FixedFields: TypePath::AddSingletonInstanceFieldAt: singleton = 0x%p(0x%p)\n",
                  pRVar1,local_48);
    Output::Print(L"   fixed fields:");
    for (local_1a = 0; bVar3 = GetPathLength(this), local_1a < bVar3; local_1a = local_1a + 1) {
      this_01 = GetPropertyId(this,(uint)local_1a);
      pcVar11 = PropertyRecord::GetBuffer(this_01);
      bVar3 = GetMaxInitializedLength(this);
      bVar6 = GetPathLength(this);
      bVar4 = GetIsFixedFieldAt(this,local_1a,(uint)bVar6);
      bVar6 = GetPathLength(this);
      bVar7 = GetIsUsedFixedFieldAt(this,local_1a,(uint)bVar6);
      Output::Print(L" %s %d%d%d,",pcVar11,(ulong)(local_1a < bVar3),(ulong)bVar4,(ulong)bVar7);
    }
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void TypePath::AddSingletonInstanceFieldAt(PropertyIndex index, int typePathLength)
    {
        Assert(index < this->GetPathLength());
        Assert(typePathLength >= this->GetMaxInitializedLength());
        Assert(index >= this->GetMaxInitializedLength());
        Assert(!this->GetData()->fixedFields.Test(index) && !this->GetData()->usedFixedFields.Test(index));

        this->SetMaxInitializedLength(index + 1);

        if (PHASE_VERBOSE_TRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("FixedFields: TypePath::AddSingletonInstanceFieldAt: singleton = 0x%p(0x%p)\n"),
                PointerValue(this->singletonInstance), this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr);
            Output::Print(_u("   fixed fields:"));

            for (PropertyIndex i = 0; i < GetPathLength(); i++)
            {
                Output::Print(_u(" %s %d%d%d,"), GetPropertyId(i)->GetBuffer(),
                    i < GetMaxInitializedLength() ? 1 : 0,
                    GetIsFixedFieldAt(i, GetPathLength()) ? 1 : 0,
                    GetIsUsedFixedFieldAt(i, GetPathLength()) ? 1 : 0);
            }

            Output::Print(_u("\n"));
        }
    }